

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionStateTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionStateTests::TestBackupSessionLog_StateLogNotNull_LogBackedUp::
~TestBackupSessionLog_StateLogNotNull_LogBackedUp
          (TestBackupSessionLog_StateLogNotNull_LogBackedUp *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(BackupSessionLog_StateLogNotNull_LogBackedUp)
  {
    SessionSettings settings;
    TestLog log;
    log.events = 5;

    SessionState state;
    state.log(&log);

    state.backup();

    CHECK_EQUAL(5, log.eventsBackup);
  }